

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentsHelper::Parse
          (cmCommandArgumentsHelper *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unconsumedArgs)

{
  cmCommandArgument *pcVar1;
  bool bVar2;
  reference key;
  reference ppcVar3;
  bool argDone;
  cmCommandArgument *ca_1;
  iterator __end2;
  iterator __begin2;
  vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *__range2;
  string *it;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  cmCommandArgument *previousArgument;
  cmCommandArgument *activeArgument;
  cmCommandArgument *ca;
  iterator __end1;
  iterator __begin1;
  vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unconsumedArgs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCommandArgumentsHelper *this_local;
  
  if (args != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0) {
    __end1 = std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::begin
                       (&this->Arguments);
    ca = (cmCommandArgument *)
         std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::end
                   (&this->Arguments);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                                       *)&ca), bVar2) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                ::operator*(&__end1);
      pcVar1 = *ppcVar3;
      cmCommandArgument::ApplyOwnGroup(pcVar1);
      cmCommandArgument::Reset(pcVar1);
      __gnu_cxx::
      __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
      ::operator++(&__end1);
    }
    previousArgument = (cmCommandArgument *)0x0;
    __range1_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(args);
    it = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(args);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&it), bVar2) {
      key = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1_1);
      __end2 = std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::begin
                         (&this->Arguments);
      ca_1 = (cmCommandArgument *)
             std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::end
                       (&this->Arguments);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                                         *)&ca_1), bVar2) {
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                  ::operator*(&__end2);
        pcVar1 = *ppcVar3;
        bVar2 = cmCommandArgument::KeyMatches(pcVar1,key);
        if ((bVar2) &&
           (bVar2 = cmCommandArgument::MayFollow(pcVar1,(cmCommandArgument *)__range1_1), bVar2)) {
          cmCommandArgument::Activate(pcVar1);
          previousArgument = pcVar1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
        ::operator++(&__end2);
      }
      if (previousArgument == (cmCommandArgument *)0x0) {
        if (unconsumedArgs !=
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(unconsumedArgs,key);
        }
      }
      else {
        bVar2 = cmCommandArgument::Consume(previousArgument,key);
        __range1_1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)previousArgument;
        if (bVar2) {
          previousArgument = (cmCommandArgument *)0x0;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
  }
  return;
}

Assistant:

void cmCommandArgumentsHelper::Parse(const std::vector<std::string>* args,
                                     std::vector<std::string>* unconsumedArgs)
{
  if (args == nullptr) {
    return;
  }

  for (cmCommandArgument* ca : this->Arguments) {
    ca->ApplyOwnGroup();
    ca->Reset();
  }

  cmCommandArgument* activeArgument = nullptr;
  const cmCommandArgument* previousArgument = nullptr;
  for (std::string const& it : *args) {
    for (cmCommandArgument* ca : this->Arguments) {
      if (ca->KeyMatches(it) && (ca->MayFollow(previousArgument))) {
        activeArgument = ca;
        activeArgument->Activate();
        break;
      }
    }

    if (activeArgument) {
      bool argDone = activeArgument->Consume(it);
      previousArgument = activeArgument;
      if (argDone) {
        activeArgument = nullptr;
      }
    } else {
      if (unconsumedArgs != nullptr) {
        unconsumedArgs->push_back(it);
      }
    }
  }
}